

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
testing::internal::MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>::
~MatcherBase(MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&> *this)

{
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }